

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sesquickselects.h
# Opt level: O0

vector<unsigned_int,_std::allocator<unsigned_int>_> * __thiscall
SesquickselectK2<long_double>::samplingParameter
          (vector<unsigned_int,_std::allocator<unsigned_int>_> *__return_storage_ptr__,
          SesquickselectK2<long_double> *this,longdouble alpha)

{
  initializer_list<unsigned_int> __l;
  initializer_list<unsigned_int> __l_00;
  initializer_list<unsigned_int> __l_01;
  allocator<unsigned_int> local_95;
  uint local_94 [3];
  iterator local_88;
  size_type local_80;
  allocator<unsigned_int> local_71;
  uint local_70 [2];
  iterator local_68;
  size_type local_60;
  allocator<unsigned_int> local_41;
  uint local_40 [2];
  iterator local_38;
  size_type local_30;
  undefined1 auStack_28 [8];
  longdouble alpha_local;
  SesquickselectK2<long_double> *this_local;
  
  _auStack_28 = alpha;
  unique0x10000193 = this;
  this_local = (SesquickselectK2<long_double> *)__return_storage_ptr__;
  if (this->nuStar <= alpha) {
    if (alpha <= (longdouble)1 - this->nuStar) {
      local_94[0] = 0;
      local_94[1] = 0;
      local_94[2] = 0;
      local_88 = local_94;
      local_80 = 3;
      std::allocator<unsigned_int>::allocator(&local_95);
      __l._M_len = local_80;
      __l._M_array = local_88;
      std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
                (__return_storage_ptr__,__l,&local_95);
      std::allocator<unsigned_int>::~allocator(&local_95);
    }
    else {
      local_70[0] = 1;
      local_70[1] = 0;
      local_68 = local_70;
      local_60 = 2;
      std::allocator<unsigned_int>::allocator(&local_71);
      __l_00._M_len = local_60;
      __l_00._M_array = local_68;
      std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
                (__return_storage_ptr__,__l_00,&local_71);
      std::allocator<unsigned_int>::~allocator(&local_71);
    }
  }
  else {
    local_40[0] = 0;
    local_40[1] = 1;
    local_38 = local_40;
    local_30 = 2;
    std::allocator<unsigned_int>::allocator(&local_41);
    __l_01._M_len = local_30;
    __l_01._M_array = local_38;
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
              (__return_storage_ptr__,__l_01,&local_41);
    std::allocator<unsigned_int>::~allocator(&local_41);
  }
  return __return_storage_ptr__;
}

Assistant:

vector<unsigned int> samplingParameter(const Num alpha) const override {
		if (alpha < nuStar) return {0, 1};
		if (alpha > 1 - nuStar) return {1, 0};
		// else
		return {0, 0, 0};
	}